

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O1

void __thiscall DepfileParserTestBasic::Run(DepfileParserTestBasic *this)

{
  pointer pSVar1;
  size_t sVar2;
  char *pcVar3;
  Test *pTVar4;
  bool bVar5;
  int iVar6;
  string err;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  string local_40;
  
  pTVar4 = g_current_test;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  bVar5 = DepfileParserTest::Parse
                    (&this->super_DepfileParserTest,
                     "build/ninja.o: ninja.cc ninja.h eval_env.h manifest_parser.h\n",&local_40);
  testing::Test::Check
            (pTVar4,bVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/depfile_parser_test.cc"
             ,0x25,
             "Parse( \"build/ninja.o: ninja.cc ninja.h eval_env.h manifest_parser.h\\n\", &err)");
  pTVar4 = g_current_test;
  iVar6 = std::__cxx11::string::compare((char *)&local_40);
  bVar5 = testing::Test::Check
                    (pTVar4,iVar6 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/depfile_parser_test.cc"
                     ,0x26,"\"\" == err");
  if (bVar5) {
    bVar5 = testing::Test::Check
                      (g_current_test,
                       (long)(this->super_DepfileParserTest).parser_.outs_.
                             super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(this->super_DepfileParserTest).parser_.outs_.
                             super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                             super__Vector_impl_data._M_start == 0x10,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/depfile_parser_test.cc"
                       ,0x27,"1u == parser_.outs_.size()");
    pTVar4 = g_current_test;
    if (bVar5) {
      pSVar1 = (this->super_DepfileParserTest).parser_.outs_.
               super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar2 = pSVar1->len_;
      if (sVar2 == 0) {
        local_60 = &local_50;
        local_58 = 0;
        local_50 = 0;
      }
      else {
        pcVar3 = pSVar1->str_;
        local_60 = &local_50;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,pcVar3,pcVar3 + sVar2);
      }
      iVar6 = std::__cxx11::string::compare((char *)&local_60);
      testing::Test::Check
                (pTVar4,iVar6 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/depfile_parser_test.cc"
                 ,0x28,"\"build/ninja.o\" == parser_.outs_[0].AsString()");
      if (local_60 != &local_50) {
        operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
      }
      testing::Test::Check
                (g_current_test,
                 (long)(this->super_DepfileParserTest).parser_.ins_.
                       super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->super_DepfileParserTest).parser_.ins_.
                       super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                       super__Vector_impl_data._M_start == 0x40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/depfile_parser_test.cc"
                 ,0x29,"4u == parser_.ins_.size()");
      goto LAB_0014b160;
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_0014b160:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(DepfileParserTest, Basic) {
  string err;
  EXPECT_TRUE(Parse(
"build/ninja.o: ninja.cc ninja.h eval_env.h manifest_parser.h\n",
      &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, parser_.outs_.size());
  EXPECT_EQ("build/ninja.o", parser_.outs_[0].AsString());
  EXPECT_EQ(4u, parser_.ins_.size());
}